

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::GlobalPooling3DLayerParams::ByteSizeLong(GlobalPooling3DLayerParams *this)

{
  GlobalPooling3DLayerParams_GlobalPoolingType3D GVar1;
  int iVar2;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  GlobalPooling3DLayerParams *this_local;
  
  sStack_18 = 0;
  GVar1 = type(this);
  if (GVar1 != GlobalPooling3DLayerParams_GlobalPoolingType3D_MAX) {
    GVar1 = type(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(GVar1);
    sStack_18 = sStack_18 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t GlobalPooling3DLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GlobalPooling3DLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.GlobalPooling3DLayerParams.GlobalPoolingType3D type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}